

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_portal.cpp
# Opt level: O0

void __thiscall GLEEHorizonPortal::DrawContents(GLEEHorizonPortal *this)

{
  uint uVar1;
  sector_t *this_00;
  double dVar2;
  bool bVar3;
  int iVar4;
  double dVar5;
  bool local_369;
  undefined1 local_368 [8];
  GLHorizonPortal floor;
  GLHorizonInfo horz_1;
  undefined1 local_240 [8];
  GLHorizonPortal ceil;
  GLHorizonInfo horz;
  undefined1 local_110 [8];
  GLSkyPortal sky;
  undefined1 local_50 [8];
  GLSkyInfo skyinfo;
  sector_t *sector;
  GLEEHorizonPortal *this_local;
  
  glcycle_t::Clock(&PortalAll);
  this_00 = this->portal->mOrigin;
  skyinfo._44_4_ = sector_t::GetTexture(this_00,0);
  bVar3 = FTextureID::operator==((FTextureID *)&skyinfo.field_0x2c,&skyflatnum);
  local_369 = true;
  if (!bVar3) {
    skyinfo.fadecolor.field_0 =
         (anon_union_4_2_12391d7c_for_PalEntry_0)sector_t::GetTexture(this_00,1);
    local_369 = FTextureID::operator==((FTextureID *)&skyinfo.fadecolor,&skyflatnum);
  }
  if (local_369 != false) {
    GLSkyInfo::GLSkyInfo((GLSkyInfo *)local_50);
    uVar1 = this_00->sky;
    PalEntry::PalEntry((PalEntry *)((long)&sky.origin + 4),0);
    GLSkyInfo::init((GLSkyInfo *)local_50,(EVP_PKEY_CTX *)(ulong)uVar1);
    GLSkyPortal::GLSkyPortal((GLSkyPortal *)local_110,(GLSkyInfo *)local_50,true);
    GLSkyPortal::DrawContents((GLSkyPortal *)local_110);
    GLSkyPortal::~GLSkyPortal((GLSkyPortal *)local_110);
  }
  horz.colormap.blendfactor = (int)sector_t::GetTexture(this_00,1);
  bVar3 = FTextureID::operator!=((FTextureID *)&horz.colormap.blendfactor,&skyflatnum);
  if (bVar3) {
    GLHorizonInfo::GLHorizonInfo((GLHorizonInfo *)&ceil.voffset);
    GLSectorPlane::GetFromSector((GLSectorPlane *)&ceil.voffset,this_00,1);
    iVar4 = sector_t::GetCeilingLight(this_00);
    horz.plane.Scale.X = (float)gl_ClampLight(iVar4);
    FColormap::operator=((FColormap *)&horz.plane.Scale.Y,this_00->ColorMap);
    dVar2 = ViewPos.Z;
    if (this->portal->mType == 4) {
      dVar5 = std::fabs((double)(ulong)(uint)horz.plane.plane.negiC._0_4_);
      horz.plane.plane.negiC._0_4_ = (float)(dVar2 + (double)SUB84(dVar5,0));
    }
    GLHorizonPortal::GLHorizonPortal
              ((GLHorizonPortal *)local_240,(GLHorizonInfo *)&ceil.voffset,true);
    GLHorizonPortal::DrawContents((GLHorizonPortal *)local_240);
    GLHorizonPortal::~GLHorizonPortal((GLHorizonPortal *)local_240);
  }
  horz_1._92_4_ = sector_t::GetTexture(this_00,0);
  bVar3 = FTextureID::operator!=((FTextureID *)&horz_1.field_0x5c,&skyflatnum);
  if (bVar3) {
    GLHorizonInfo::GLHorizonInfo((GLHorizonInfo *)&floor.voffset);
    GLSectorPlane::GetFromSector((GLSectorPlane *)&floor.voffset,this_00,0);
    iVar4 = sector_t::GetFloorLight(this_00);
    horz_1.plane.Scale.X = (float)gl_ClampLight(iVar4);
    FColormap::operator=((FColormap *)&horz_1.plane.Scale.Y,this_00->ColorMap);
    dVar2 = ViewPos.Z;
    if (this->portal->mType == 4) {
      dVar5 = std::fabs((double)(ulong)(uint)horz_1.plane.plane.negiC._0_4_);
      horz_1.plane.plane.negiC._0_4_ = (float)(dVar2 - (double)SUB84(dVar5,0));
    }
    GLHorizonPortal::GLHorizonPortal
              ((GLHorizonPortal *)local_368,(GLHorizonInfo *)&floor.voffset,true);
    GLHorizonPortal::DrawContents((GLHorizonPortal *)local_368);
    GLHorizonPortal::~GLHorizonPortal((GLHorizonPortal *)local_368);
  }
  return;
}

Assistant:

void GLEEHorizonPortal::DrawContents()
{
	PortalAll.Clock();
	sector_t *sector = portal->mOrigin;
	if (sector->GetTexture(sector_t::floor) == skyflatnum ||
		sector->GetTexture(sector_t::ceiling) == skyflatnum)
	{
		GLSkyInfo skyinfo;
		skyinfo.init(sector->sky, 0);
		GLSkyPortal sky(&skyinfo, true);
		sky.DrawContents();
	}
	if (sector->GetTexture(sector_t::ceiling) != skyflatnum)
	{
		GLHorizonInfo horz;
		horz.plane.GetFromSector(sector, true);
		horz.lightlevel = gl_ClampLight(sector->GetCeilingLight());
		horz.colormap = sector->ColorMap;
		if (portal->mType == PORTS_PLANE)
		{
			horz.plane.Texheight = ViewPos.Z + fabs(horz.plane.Texheight);
		}
		GLHorizonPortal ceil(&horz, true);
		ceil.DrawContents();
	}
	if (sector->GetTexture(sector_t::floor) != skyflatnum)
	{
		GLHorizonInfo horz;
		horz.plane.GetFromSector(sector, false);
		horz.lightlevel = gl_ClampLight(sector->GetFloorLight());
		horz.colormap = sector->ColorMap;
		if (portal->mType == PORTS_PLANE)
		{
			horz.plane.Texheight = ViewPos.Z - fabs(horz.plane.Texheight);
		}
		GLHorizonPortal floor(&horz, true);
		floor.DrawContents();
	}



}